

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleCMakePathCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool nativePath)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  reference p;
  char *pcVar3;
  string *path_00;
  reference pSVar4;
  ulong uVar5;
  char *pcVar6;
  string *psVar7;
  undefined1 auVar8 [16];
  allocator local_181;
  string local_180;
  stl_string local_160;
  String local_140;
  reference local_120;
  String *s;
  String local_f8;
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_d8;
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_d0;
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_c8;
  iterator j;
  string value;
  char *var;
  undefined1 local_90 [8];
  vector<cmsys::String,_std::allocator<cmsys::String>_> path;
  char pathSep;
  allocator local_51;
  string local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  const_iterator i;
  bool nativePath_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current._7_1_ = nativePath;
  local_30._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 == 3) {
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30,0);
    path.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = ':';
    p = __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_30);
    cmsys::SystemTools::SplitString
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_90,p,
               path.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_,false);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_30,0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_30);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::string((string *)&j);
    local_c8._M_current =
         (String *)
         std::vector<cmsys::String,_std::allocator<cmsys::String>_>::begin
                   ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_90);
    while( true ) {
      local_d0._M_current =
           (String *)
           std::vector<cmsys::String,_std::allocator<cmsys::String>_>::end
                     ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_90);
      bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d0);
      if (!bVar1) break;
      local_d8._M_current =
           (String *)
           std::vector<cmsys::String,_std::allocator<cmsys::String>_>::begin
                     ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_90);
      bVar1 = __gnu_cxx::operator!=(&local_c8,&local_d8);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)&j,";");
      }
      if ((i._M_current._7_1_ & 1) == 0) {
        path_00 = &__gnu_cxx::
                   __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
                   ::operator*(&local_c8)->super_string;
        cmsys::SystemTools::ConvertToUnixSlashes(path_00);
      }
      else {
        __gnu_cxx::
        __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
        ::operator->(&local_c8);
        auVar8 = std::__cxx11::string::c_str();
        cmSystemTools::ConvertToOutputPath_abi_cxx11_((string *)&s,auVar8._0_8_,auVar8._8_8_);
        cmsys::String::String(&local_f8,(stl_string *)&s,0,0xffffffffffffffff);
        pSVar4 = __gnu_cxx::
                 __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
                 ::operator*(&local_c8);
        cmsys::String::operator=(pSVar4,&local_f8);
        cmsys::String::~String(&local_f8);
        std::__cxx11::string::~string((string *)&s);
        local_120 = __gnu_cxx::
                    __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
                    ::operator*(&local_c8);
        uVar5 = std::__cxx11::string::size();
        if ((1 < uVar5) &&
           (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_120), pSVar4 = local_120,
           *pcVar6 == '\"')) {
          std::__cxx11::string::size();
          pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)pSVar4);
          pSVar4 = local_120;
          if (*pcVar6 == '\"') {
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)&local_160,(ulong)pSVar4);
            cmsys::String::String(&local_140,&local_160,0,0xffffffffffffffff);
            cmsys::String::operator=(local_120,&local_140);
            cmsys::String::~String(&local_140);
            std::__cxx11::string::~string((string *)&local_160);
          }
        }
      }
      psVar7 = (string *)
               __gnu_cxx::
               __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
               ::operator*(&local_c8);
      std::__cxx11::string::operator+=((string *)&j,psVar7);
      __gnu_cxx::
      __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
      ::operator++(&local_c8);
    }
    this_00 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_180,pcVar3,&local_181);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition(this_00,&local_180,pcVar3);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator((allocator<char> *)&local_181);
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)&j);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_90);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,
               "FILE([TO_CMAKE_PATH|TO_NATIVE_PATH] path result) must be called with exactly three arguments."
               ,&local_51);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileCommand::HandleCMakePathCommand(
  std::vector<std::string> const& args, bool nativePath)
{
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() != 3) {
    this->SetError("FILE([TO_CMAKE_PATH|TO_NATIVE_PATH] path result) must be "
                   "called with exactly three arguments.");
    return false;
  }
  i++; // Get rid of subcommand
#if defined(_WIN32) && !defined(__CYGWIN__)
  char pathSep = ';';
#else
  char pathSep = ':';
#endif
  std::vector<cmsys::String> path = cmSystemTools::SplitString(*i, pathSep);
  i++;
  const char* var = i->c_str();
  std::string value;
  for (std::vector<cmsys::String>::iterator j = path.begin(); j != path.end();
       ++j) {
    if (j != path.begin()) {
      value += ";";
    }
    if (!nativePath) {
      cmSystemTools::ConvertToUnixSlashes(*j);
    } else {
      *j = cmSystemTools::ConvertToOutputPath(j->c_str());
      // remove double quotes in the path
      cmsys::String& s = *j;

      if (s.size() > 1 && s[0] == '\"' && s[s.size() - 1] == '\"') {
        s = s.substr(1, s.size() - 2);
      }
    }
    value += *j;
  }
  this->Makefile->AddDefinition(var, value.c_str());
  return true;
}